

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tweakable.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Tweakable::Data::Data(Data *this,string *prefix,string *replace)

{
  string *replace_local;
  string *prefix_local;
  Data *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)prefix);
  std::__cxx11::string::string((string *)&this->replace,(string *)replace);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Corrade::Utility::(anonymous_namespace)::File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Corrade::Utility::(anonymous_namespace)::File>_>_>
  ::unordered_map(&this->files);
  this->currentScopeLambda = (_func_void__func_void_ptr_void_ptr *)0x0;
  this->currentScopeUserCall = (_func_void *)0x0;
  this->currentScopeUserData = (void *)0x0;
  return;
}

Assistant:

explicit Data(const std::string& prefix, const std::string& replace): prefix{prefix}, replace{replace} {}